

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall Controller::HandleInput(Controller *this,bool *running,Snake *snake)

{
  int iVar1;
  int local_58 [2];
  SDL_Event e;
  Snake *snake_local;
  bool *running_local;
  Controller *this_local;
  
  e._48_8_ = snake;
  snake_local = (Snake *)running;
  running_local = (bool *)this;
  while (iVar1 = SDL_PollEvent(local_58), iVar1 != 0) {
    if (local_58[0] == 0x100) {
      *(undefined1 *)&snake_local->direction = kUp;
    }
    else if (local_58[0] == 0x300) {
      switch(e.motion.which) {
      case 0x4000004f:
        ChangeDirection(this,(Snake *)e._48_8_,kRight,kLeft);
        break;
      case 0x40000050:
        ChangeDirection(this,(Snake *)e._48_8_,kLeft,kRight);
        break;
      case 0x40000051:
        ChangeDirection(this,(Snake *)e._48_8_,kDown,kUp);
        break;
      case 0x40000052:
        ChangeDirection(this,(Snake *)e._48_8_,kUp,kDown);
      }
    }
  }
  return;
}

Assistant:

void Controller::HandleInput(bool &running, Snake &snake) const {
  SDL_Event e;
  while (SDL_PollEvent(&e)) {
    if (e.type == SDL_QUIT) {
      running = false;
    } else if (e.type == SDL_KEYDOWN) {
      switch (e.key.keysym.sym) {
        case SDLK_UP:
          ChangeDirection(snake, Snake::Direction::kUp,
                          Snake::Direction::kDown);
          break;

        case SDLK_DOWN:
          ChangeDirection(snake, Snake::Direction::kDown,
                          Snake::Direction::kUp);
          break;

        case SDLK_LEFT:
          ChangeDirection(snake, Snake::Direction::kLeft,
                          Snake::Direction::kRight);
          break;

        case SDLK_RIGHT:
          ChangeDirection(snake, Snake::Direction::kRight,
                          Snake::Direction::kLeft);
          break;
      }
    }
  }
}